

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

FeatureDescriptor * __thiscall
cmComputeLinkInformation::GetGroupFeature(cmComputeLinkInformation *this,string *feature)

{
  cmMakefile *pcVar1;
  cmake *pcVar2;
  iterator iVar3;
  bool bVar4;
  string *psVar5;
  pointer ppVar6;
  size_type sVar7;
  reference pvVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_bool>
  pVar9;
  FeatureDescriptor local_7b8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
  local_708;
  undefined1 local_700;
  undefined1 local_6f8 [64];
  cmAlphaNum local_6b8;
  string local_688;
  undefined8 local_668;
  undefined1 local_660 [8];
  string local_658;
  string local_638;
  string local_618;
  GroupFeatureDescriptor local_5f8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
  local_550;
  undefined1 local_548;
  undefined1 local_540 [24];
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  items;
  undefined1 local_508 [40];
  _Base_ptr p_Stack_4e0;
  size_type local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_4d0;
  _Base_ptr p_Stack_4c0;
  undefined1 local_4b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_490;
  _Base_ptr p_Stack_480;
  _Base_ptr local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_470;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
  local_458;
  undefined1 local_450;
  undefined1 local_448 [64];
  cmAlphaNum local_408;
  string local_3d8;
  cmValue local_3b8;
  cmValue langFeature;
  _Base_ptr local_398;
  _Base_ptr p_Stack_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_388;
  _Base_ptr local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_360;
  _Base_ptr p_Stack_350;
  _Base_ptr local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_340;
  _Base_ptr p_Stack_330;
  _Base_ptr local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_320;
  _Base_ptr p_Stack_310;
  pointer local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_300;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
  local_2f0;
  undefined1 local_2e8 [8];
  undefined1 local_2e0 [64];
  cmAlphaNum local_2a0;
  string local_270;
  cmAlphaNum local_250;
  cmAlphaNum local_220;
  string local_1f0;
  _Base_ptr local_1d0;
  cmAlphaNum local_1c8;
  cmAlphaNum local_198;
  string local_168;
  cmAlphaNum local_148;
  cmAlphaNum local_108;
  string local_d8;
  cmValue local_b8;
  cmValue featureSupported;
  cmAlphaNum local_80;
  undefined1 local_50 [8];
  string featureName;
  _Self local_28;
  iterator it;
  string *feature_local;
  cmComputeLinkInformation *this_local;
  
  it._M_node = (_Base_ptr)feature;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
       ::find(&this->GroupFeatureDescriptors,feature);
  featureName.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
       ::end(&this->GroupFeatureDescriptors);
  bVar4 = std::operator!=(&local_28,(_Self *)((long)&featureName.field_2 + 8));
  if (bVar4) {
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
             ::operator->(&local_28);
    this_local = (cmComputeLinkInformation *)&ppVar6->second;
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_80,"CMAKE_");
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&featureSupported,&this->LinkLanguage);
    cmStrCat<char[19],std::__cxx11::string>
              ((string *)local_50,&local_80,(cmAlphaNum *)&featureSupported,(char (*) [19])0xd5cd0c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)it._M_node);
    pcVar1 = this->Makefile;
    cmAlphaNum::cmAlphaNum(&local_108,(string *)local_50);
    cmAlphaNum::cmAlphaNum(&local_148,"_SUPPORTED");
    cmStrCat<>(&local_d8,&local_108,&local_148);
    local_b8 = cmMakefile::GetDefinition(pcVar1,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    bVar4 = cmValue::operator_cast_to_bool(&local_b8);
    if (!bVar4) {
      cmAlphaNum::cmAlphaNum(&local_198,"CMAKE_LINK_GROUP_USING_");
      cmAlphaNum::cmAlphaNum(&local_1c8,(string *)it._M_node);
      cmStrCat<>(&local_168,&local_198,&local_1c8);
      std::__cxx11::string::operator=((string *)local_50,(string *)&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      pcVar1 = this->Makefile;
      cmAlphaNum::cmAlphaNum(&local_220,(string *)local_50);
      cmAlphaNum::cmAlphaNum(&local_250,"_SUPPORTED");
      cmStrCat<>(&local_1f0,&local_220,&local_250);
      local_1d0 = (_Base_ptr)cmMakefile::GetDefinition(pcVar1,&local_1f0);
      local_b8 = (cmValue)local_1d0;
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    bVar4 = cmValue::IsOn(&local_b8);
    if (bVar4) {
      local_3b8 = cmMakefile::GetDefinition(this->Makefile,(string *)local_50);
      bVar4 = cmValue::operator_cast_to_bool(&local_3b8);
      if (bVar4) {
        psVar5 = cmValue::operator_cast_to_string_(&local_3b8);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_540);
        cmExpandListWithBacktrace
                  ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_540 + 0x10),psVar5,(cmListFileBacktrace *)local_540,true);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_540);
        cmGeneratorTarget::ResolveLinkerWrapper
                  (this->Target,
                   (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_540 + 0x10),&this->LinkLanguage,true);
        sVar7 = std::
                vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_540 + 0x10));
        iVar3 = it;
        if (sVar7 == 2) {
          std::__cxx11::string::string((string *)&local_618,(string *)it._M_node);
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_540 + 0x10),0);
          std::__cxx11::string::string((string *)(local_660 + 0x28),(string *)pvVar8);
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_540 + 0x10),1);
          std::__cxx11::string::string((string *)(local_660 + 8),(string *)pvVar8);
          GroupFeatureDescriptor::GroupFeatureDescriptor
                    (&local_5f8,&local_618,(string *)(local_660 + 0x28),(string *)(local_660 + 8));
          pVar9 = std::
                  map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                  ::
                  emplace<std::__cxx11::string_const&,cmComputeLinkInformation::GroupFeatureDescriptor>
                            ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                              *)&this->GroupFeatureDescriptors,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             iVar3._M_node,&local_5f8);
          local_668 = pVar9.first._M_node;
          local_660[0] = pVar9.second;
          local_550._M_node = (_Base_ptr)local_668;
          local_548 = local_660[0];
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
                   ::operator->(&local_550);
          GroupFeatureDescriptor::~GroupFeatureDescriptor(&local_5f8);
          std::__cxx11::string::~string((string *)(local_660 + 8));
          std::__cxx11::string::~string((string *)(local_660 + 0x28));
          std::__cxx11::string::~string((string *)&local_618);
        }
        else {
          pcVar2 = this->CMakeInstance;
          cmAlphaNum::cmAlphaNum(&local_6b8,"Feature \'");
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)(local_6f8 + 0x10),(string *)it._M_node);
          psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          cmStrCat<char[27],std::__cxx11::string,char[79],std::__cxx11::string,char[3]>
                    (&local_688,&local_6b8,(cmAlphaNum *)(local_6f8 + 0x10),
                     (char (*) [27])"\', specified by variable \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     (char (*) [79])
                     "\', is malformed (wrong number of elements) and cannot be used to link target \'"
                     ,psVar5,(char (*) [3])0xd3b0af);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_6f8);
          cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_688,(cmListFileBacktrace *)local_6f8);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_6f8);
          std::__cxx11::string::~string((string *)&local_688);
          iVar3 = it;
          local_7b8.ItemNameFormat._M_string_length = 0;
          local_7b8.ItemNameFormat.field_2._M_allocated_capacity = 0;
          local_7b8.ItemPathFormat.field_2._8_8_ = 0;
          local_7b8.ItemNameFormat._M_dataplus = (_Alloc_hider)0x0;
          local_7b8.ItemNameFormat._1_7_ = 0;
          local_7b8.ItemPathFormat._M_string_length = 0;
          local_7b8.ItemPathFormat.field_2._M_allocated_capacity = 0;
          local_7b8.Suffix.field_2._8_8_ = 0;
          local_7b8.ItemPathFormat._M_dataplus = (_Alloc_hider)0x0;
          local_7b8.ItemPathFormat._1_7_ = 0;
          local_7b8.Suffix._M_string_length = 0;
          local_7b8.Suffix.field_2._M_allocated_capacity = 0;
          local_7b8.Prefix.field_2._8_8_ = 0;
          local_7b8.Suffix._M_dataplus = (_Alloc_hider)0x0;
          local_7b8.Suffix._1_7_ = 0;
          local_7b8.Prefix._M_string_length = 0;
          local_7b8.Prefix.field_2._M_allocated_capacity = 0;
          local_7b8.Supported = false;
          local_7b8._33_7_ = 0;
          local_7b8.Prefix._M_dataplus = (_Alloc_hider)0x0;
          local_7b8.Prefix._1_7_ = 0;
          local_7b8.Name.field_2._M_allocated_capacity = 0;
          local_7b8.Name.field_2._8_8_ = 0;
          local_7b8.Name._M_dataplus = (_Alloc_hider)0x0;
          local_7b8.Name._1_7_ = 0;
          local_7b8.Name._M_string_length = 0;
          local_7b8.ItemNameFormat.field_2._8_8_ = 0;
          FeatureDescriptor::FeatureDescriptor(&local_7b8);
          pVar9 = std::
                  map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                  ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                            ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                              *)&this->GroupFeatureDescriptors,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             iVar3._M_node,&local_7b8);
          local_708 = pVar9.first._M_node;
          local_700 = pVar9.second;
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
                   ::operator->(&local_708);
          FeatureDescriptor::~FeatureDescriptor(&local_7b8);
        }
        this_local = (cmComputeLinkInformation *)&ppVar6->second;
        langFeature.Value._4_4_ = 1;
        std::
        vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_540 + 0x10));
      }
      else {
        pcVar2 = this->CMakeInstance;
        cmAlphaNum::cmAlphaNum(&local_408,"Feature \'");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)(local_448 + 0x10),(string *)it._M_node);
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        cmStrCat<char[75],std::__cxx11::string,char[28],std::__cxx11::string,char[17]>
                  (&local_3d8,&local_408,(cmAlphaNum *)(local_448 + 0x10),
                   (char (*) [75])
                   "\', specified through generator-expression \'$<LINK_GROUP>\' to link target \'",
                   psVar5,(char (*) [28])"\', is not defined for the \'",&this->LinkLanguage,
                   (char (*) [17])"\' link language.");
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_448);
        cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_3d8,(cmListFileBacktrace *)local_448);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_448);
        std::__cxx11::string::~string((string *)&local_3d8);
        iVar3 = it;
        local_478 = (_Base_ptr)0x0;
        aStack_470._M_allocated_capacity = 0;
        aStack_490._8_8_ = 0;
        p_Stack_480 = (_Base_ptr)0x0;
        aStack_4a0._8_8_ = (_Base_ptr)0x0;
        aStack_490._M_allocated_capacity = 0;
        local_4b8._16_8_ = 0;
        aStack_4a0._M_allocated_capacity = 0;
        local_4b8._0_8_ = 0;
        local_4b8._8_8_ = 0;
        aStack_4d0._8_8_ = 0;
        p_Stack_4c0 = (_Base_ptr)0x0;
        local_4d8 = 0;
        aStack_4d0._M_allocated_capacity = 0;
        local_508._32_8_ = (_Base_ptr)0x0;
        p_Stack_4e0 = (_Base_ptr)0x0;
        local_508._16_8_ = 0;
        local_508._24_8_ = 0;
        local_508._0_8_ = 0;
        local_508._8_8_ = (_Base_ptr)0x0;
        aStack_470._8_8_ = 0;
        FeatureDescriptor::FeatureDescriptor((FeatureDescriptor *)local_508);
        pVar9 = std::
                map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                          ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                            *)&this->GroupFeatureDescriptors,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           iVar3._M_node,(FeatureDescriptor *)local_508);
        items.
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVar9.first._M_node;
        local_450 = pVar9.second;
        local_458._M_node =
             (_Base_ptr)
             items.
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
                 ::operator->(&local_458);
        this_local = (cmComputeLinkInformation *)&ppVar6->second;
        FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_508);
        langFeature.Value._4_4_ = 1;
      }
    }
    else {
      pcVar2 = this->CMakeInstance;
      cmAlphaNum::cmAlphaNum(&local_2a0,"Feature \'");
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)(local_2e0 + 0x10),(string *)it._M_node);
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      cmStrCat<char[75],std::__cxx11::string,char[30],std::__cxx11::string,char[17]>
                (&local_270,&local_2a0,(cmAlphaNum *)(local_2e0 + 0x10),
                 (char (*) [75])
                 "\', specified through generator-expression \'$<LINK_GROUP>\' to link target \'",
                 psVar5,(char (*) [30])"\', is not supported for the \'",&this->LinkLanguage,
                 (char (*) [17])"\' link language.");
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_2e0);
      cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_270,(cmListFileBacktrace *)local_2e0);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_2e0);
      std::__cxx11::string::~string((string *)&local_270);
      iVar3 = it;
      local_308 = (pointer)0x0;
      aStack_300._M_allocated_capacity = 0;
      aStack_320._8_8_ = 0;
      p_Stack_310 = (_Base_ptr)0x0;
      local_328 = (_Base_ptr)0x0;
      aStack_320._M_allocated_capacity = 0;
      aStack_340._8_8_ = 0;
      p_Stack_330 = (_Base_ptr)0x0;
      local_348 = (_Base_ptr)0x0;
      aStack_340._M_allocated_capacity = 0;
      aStack_360._8_8_ = 0;
      p_Stack_350 = (_Base_ptr)0x0;
      aStack_370._8_8_ = (_Base_ptr)0x0;
      aStack_360._M_allocated_capacity = 0;
      local_378 = (_Base_ptr)0x0;
      aStack_370._M_allocated_capacity = 0;
      local_388._M_allocated_capacity = 0;
      local_388._8_8_ = 0;
      local_398 = (_Base_ptr)0x0;
      p_Stack_390 = (_Base_ptr)0x0;
      aStack_300._8_8_ = 0;
      FeatureDescriptor::FeatureDescriptor((FeatureDescriptor *)&local_398);
      pVar9 = std::
              map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
              ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                        ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                          *)&this->GroupFeatureDescriptors,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         iVar3._M_node,(FeatureDescriptor *)&local_398);
      local_2f0 = pVar9.first._M_node;
      local_2e8[0] = pVar9.second;
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
               ::operator->(&local_2f0);
      this_local = (cmComputeLinkInformation *)&ppVar6->second;
      FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)&local_398);
      langFeature.Value._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return (FeatureDescriptor *)this_local;
}

Assistant:

cmComputeLinkInformation::FeatureDescriptor const&
cmComputeLinkInformation::GetGroupFeature(std::string const& feature)
{
  auto it = this->GroupFeatureDescriptors.find(feature);
  if (it != this->GroupFeatureDescriptors.end()) {
    return it->second;
  }

  auto featureName =
    cmStrCat("CMAKE_", this->LinkLanguage, "_LINK_GROUP_USING_", feature);
  cmValue featureSupported =
    this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  if (!featureSupported) {
    // language specific variable is not defined, fallback to the more generic
    // one
    featureName = cmStrCat("CMAKE_LINK_GROUP_USING_", feature);
    featureSupported =
      this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  }
  if (!featureSupported.IsOn()) {
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature,
               "', specified through generator-expression '$<LINK_GROUP>' to "
               "link target '",
               this->Target->GetName(), "', is not supported for the '",
               this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());
    return this->GroupFeatureDescriptors.emplace(feature, FeatureDescriptor{})
      .first->second;
  }

  cmValue langFeature = this->Makefile->GetDefinition(featureName);
  if (!langFeature) {
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature,
               "', specified through generator-expression '$<LINK_GROUP>' to "
               "link target '",
               this->Target->GetName(), "', is not defined for the '",
               this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());
    return this->GroupFeatureDescriptors.emplace(feature, FeatureDescriptor{})
      .first->second;
  }

  auto items =
    cmExpandListWithBacktrace(langFeature, this->Target->GetBacktrace(), true);

  // replace LINKER: pattern
  this->Target->ResolveLinkerWrapper(items, this->LinkLanguage, true);

  if (items.size() == 2) {
    return this->GroupFeatureDescriptors
      .emplace(
        feature,
        GroupFeatureDescriptor{ feature, items[0].Value, items[1].Value })
      .first->second;
  }

  this->CMakeInstance->IssueMessage(
    MessageType::FATAL_ERROR,
    cmStrCat("Feature '", feature, "', specified by variable '", featureName,
             "', is malformed (wrong number of elements) and cannot be used "
             "to link target '",
             this->Target->GetName(), "'."),
    this->Target->GetBacktrace());
  return this->GroupFeatureDescriptors.emplace(feature, FeatureDescriptor{})
    .first->second;
}